

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::LegacyReporterAdapter::testCaseEnded
          (LegacyReporterAdapter *this,TestCaseStats *testCaseStats)

{
  IReporter *pIVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  
  pIVar1 = (this->m_legacyReporter).m_p;
  UNRECOVERED_JUMPTABLE = (pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[10];
  (*UNRECOVERED_JUMPTABLE)
            (pIVar1,&testCaseStats->testInfo,&testCaseStats->totals,&testCaseStats->stdOut,
             &testCaseStats->stdErr,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

T* operator->() const { return m_p; }